

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperRefs.c
# Opt level: O0

float Map_MappingGetArea(Map_Man_t *pMan)

{
  Map_Node_t *p;
  int iVar1;
  int local_20;
  float local_1c;
  int i;
  float Area;
  Map_Node_t *pNode;
  Map_Man_t *pMan_local;
  
  local_1c = 0.0;
  if (pMan->fUseProfile != 0) {
    Mio_LibraryCleanProfile2(pMan->pSuperLib->pGenlib);
  }
  local_20 = 0;
  do {
    if (pMan->vMapObjs->nSize <= local_20) {
      for (local_20 = 0; local_20 < pMan->nOutputs; local_20 = local_20 + 1) {
        iVar1 = Map_NodeIsVar(pMan->pOutputs[local_20]);
        if ((iVar1 != 0) && (((ulong)pMan->pOutputs[local_20] & 1) == 0)) {
          local_1c = pMan->pSuperLib->AreaBuf + local_1c;
        }
      }
      return local_1c;
    }
    p = pMan->vMapObjs->pArray[local_20];
    if ((p->nRefAct[2] != 0) && (iVar1 = Map_NodeIsBuf(p), iVar1 == 0)) {
      if ((p->pCutBest[0] == (Map_Cut_t *)0x0) && (p->pCutBest[1] == (Map_Cut_t *)0x0)) {
        __assert_fail("pNode->pCutBest[0] != NULL || pNode->pCutBest[1] != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperRefs.c"
                      ,500,"float Map_MappingGetArea(Map_Man_t *)");
      }
      if ((p->nRefAct[0] < 1) && (p->nRefAct[1] < 1)) {
        __assert_fail("pNode->nRefAct[0] > 0 || pNode->nRefAct[1] > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperRefs.c"
                      ,0x1f6,"float Map_MappingGetArea(Map_Man_t *)");
      }
      iVar1 = Map_NodeIsAnd(p);
      if (iVar1 != 0) {
        if ((p->pCutBest[0] != (Map_Cut_t *)0x0) &&
           (((0 < p->nRefAct[0] || (p->pCutBest[1] == (Map_Cut_t *)0x0)) &&
            (local_1c = (p->pCutBest[0]->M[0].pSuperBest)->Area + local_1c, pMan->fUseProfile != 0))
           )) {
          Mio_GateIncProfile2((p->pCutBest[0]->M[0].pSuperBest)->pRoot);
        }
        if (((p->pCutBest[1] != (Map_Cut_t *)0x0) &&
            ((0 < p->nRefAct[1] || (p->pCutBest[0] == (Map_Cut_t *)0x0)))) &&
           (local_1c = (p->pCutBest[1]->M[1].pSuperBest)->Area + local_1c, pMan->fUseProfile != 0))
        {
          Mio_GateIncProfile2((p->pCutBest[1]->M[1].pSuperBest)->pRoot);
        }
      }
      if (((p->pCutBest[0] == (Map_Cut_t *)0x0) && (0 < p->nRefAct[0])) ||
         ((p->pCutBest[1] == (Map_Cut_t *)0x0 && (0 < p->nRefAct[1])))) {
        local_1c = pMan->pSuperLib->AreaInv + local_1c;
      }
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

float Map_MappingGetArea( Map_Man_t * pMan )
{
    Map_Node_t * pNode;
    float Area = 0.0;
    int i;
    if ( pMan->fUseProfile )
        Mio_LibraryCleanProfile2( pMan->pSuperLib->pGenlib );
    for ( i = 0; i < pMan->vMapObjs->nSize; i++ )
    {
        pNode = pMan->vMapObjs->pArray[i];
        if ( pNode->nRefAct[2] == 0 )
            continue;
        if ( Map_NodeIsBuf(pNode) )
            continue;
        // at least one phase has the best cut assigned
        assert( pNode->pCutBest[0] != NULL || pNode->pCutBest[1] != NULL );
        // at least one phase is used in the mapping
        assert( pNode->nRefAct[0] > 0 || pNode->nRefAct[1] > 0 );
        // compute the array due to the supergate
        if ( Map_NodeIsAnd(pNode) )
        {
            // count area of the negative phase
            if ( pNode->pCutBest[0] && (pNode->nRefAct[0] > 0 || pNode->pCutBest[1] == NULL) )
            {
                Area += pNode->pCutBest[0]->M[0].pSuperBest->Area;
                if ( pMan->fUseProfile )
                    Mio_GateIncProfile2( pNode->pCutBest[0]->M[0].pSuperBest->pRoot );
            }
            // count area of the positive phase
            if ( pNode->pCutBest[1] && (pNode->nRefAct[1] > 0 || pNode->pCutBest[0] == NULL) )
            {
                Area += pNode->pCutBest[1]->M[1].pSuperBest->Area;
                if ( pMan->fUseProfile )
                    Mio_GateIncProfile2( pNode->pCutBest[1]->M[1].pSuperBest->pRoot );
            }
        }
        // count area of the interver if we need to implement one phase with another phase
        if ( (pNode->pCutBest[0] == NULL && pNode->nRefAct[0] > 0) || 
             (pNode->pCutBest[1] == NULL && pNode->nRefAct[1] > 0) )
            Area += pMan->pSuperLib->AreaInv;
    }
    // add buffers for each CO driven by a CI
    for ( i = 0; i < pMan->nOutputs; i++ )
        if ( Map_NodeIsVar(pMan->pOutputs[i]) && !Map_IsComplement(pMan->pOutputs[i]) )
            Area += pMan->pSuperLib->AreaBuf;
    return Area;
}